

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

int enet_socket_connect(ENetSocket socket,ENetAddress *address)

{
  undefined8 uVar1;
  int iVar2;
  int *piVar3;
  sockaddr_in6 sin;
  sockaddr local_28;
  undefined4 uStack_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  
  uStack_10 = 0;
  local_28.sa_data._0_2_ = address->port << 8 | address->port >> 8;
  local_28.sa_family = 10;
  local_28.sa_data._2_4_ = 0;
  uVar1 = *(undefined8 *)((long)&address->field_0 + 8);
  local_28.sa_data._6_4_ = SUB84(*(undefined8 *)&address->field_0,0);
  local_28.sa_data._10_4_ = SUB84((ulong)*(undefined8 *)&address->field_0 >> 0x20,0);
  uStack_18 = (undefined4)uVar1;
  uStack_14 = (undefined4)((ulong)uVar1 >> 0x20);
  iVar2 = connect(socket,&local_28,0x1c);
  if ((iVar2 == -1) && (piVar3 = __errno_location(), *piVar3 == 0x73)) {
    return 0;
  }
  return iVar2;
}

Assistant:

int enet_socket_connect(ENetSocket socket, const ENetAddress* address) {
	int result = -1;
	struct sockaddr_in6 sin;

	memset(&sin, 0, sizeof(struct sockaddr_in6));

	sin.sin6_family = AF_INET6;
	sin.sin6_port = ENET_HOST_TO_NET_16(address->port);
	sin.sin6_addr = address->ipv6;

	result = connect(socket, (struct sockaddr*)&sin, sizeof(struct sockaddr_in6));

	if (result == -1 && errno == EINPROGRESS)
		return 0;

	return result;
}